

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_request.cpp
# Opt level: O1

int __thiscall HTTPRequest::parse_header_line(HTTPRequest *this,char *str,ssize_t size)

{
  int iVar1;
  mapped_type *this_00;
  long lVar2;
  long lVar3;
  long lVar4;
  key_type local_68;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  if (size < 2) {
    lVar2 = 0;
    lVar4 = 1;
  }
  else {
    lVar2 = size + -1;
    lVar3 = 1;
    do {
      if ((str[lVar3 + -1] == ':') && (str[lVar3] == ' ')) {
        lVar2 = lVar3 + -1;
        lVar4 = lVar3;
        break;
      }
      lVar3 = lVar3 + 1;
      lVar4 = size;
    } while (size != lVar3);
  }
  iVar1 = -1;
  if (lVar4 != size) {
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_48,str + lVar2 + 2,str + size);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,str,str + lVar2);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this->header,&local_68);
    std::__cxx11::string::operator=((string *)this_00,(string *)local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int HTTPRequest::parse_header_line(const char *str, ssize_t size) {
    ssize_t i = size;
    for (i = 0; i + 1 < size; i++) {
        if (str[i] == ':' && str[i + 1] == ' ') {
            break;
        }
    }
    if (i + 1 == size) {
        return -1;
    } else {
        this->header[std::string(str, i * sizeof(char))] = std::string(str + i + 2, (size - i - 2) * sizeof(char));
        return 0;
    }
}